

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QString * __thiscall
QCalendarBackend::standaloneMonthName
          (QString *__return_storage_ptr__,QCalendarBackend *this,QLocale *locale,int month,
          int param_3,FormatType format)

{
  QLocalePrivate *pQVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar3;
  ulong uVar4;
  QCalendarLocale *localeData;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  DataRange local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (locale->d).d.ptr;
  iVar2 = (*this->_vptr_QCalendarBackend[0x19])(this);
  localeData = (QCalendarLocale *)(pQVar1->m_index * 0x1a + CONCAT44(extraout_var,iVar2));
  iVar2 = (*this->_vptr_QCalendarBackend[0x1a])(this);
  if (format == NarrowFormat) {
    uVar3 = (ulong)localeData->m_narrowMonthStandalone_idx;
    uVar4 = (ulong)localeData->m_narrowMonthStandalone_size;
  }
  else if (format == ShortFormat) {
    uVar3 = (ulong)localeData->m_shortMonthStandalone_idx;
    uVar4 = (ulong)localeData->m_shortMonthStandalone_size;
  }
  else {
    if (format != LongFormat) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        return __return_storage_ptr__;
      }
      goto LAB_002dd674;
    }
    uVar3 = (ulong)localeData->m_longMonthStandalone_idx;
    uVar4 = (ulong)localeData->m_longMonthStandalone_size;
  }
  local_40 = (DataRange)(uVar4 << 0x20 | uVar3);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QLocaleData::DataRange::getListEntry
            ((QString *)&local_58,&local_40,(char16_t *)CONCAT44(extraout_var_00,iVar2),
             (long)(month + -1));
  if ((undefined1 *)local_58.size == (undefined1 *)0x0) {
    rawMonthName(__return_storage_ptr__,localeData,(char16_t *)CONCAT44(extraout_var_00,iVar2),month
                 ,format);
  }
  else {
    (__return_storage_ptr__->d).d = local_58.d;
    (__return_storage_ptr__->d).ptr = local_58.ptr;
    (__return_storage_ptr__->d).size = local_58.size;
    if (local_58.d != (Data *)0x0) {
      LOCK();
      ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_002dd674:
  __stack_chk_fail();
}

Assistant:

QString QCalendarBackend::standaloneMonthName(const QLocale &locale, int month, int,
                                              QLocale::FormatType format) const
{
    Q_ASSERT(month >= 1 && month <= maximumMonthsInYear());
    return rawStandaloneMonthName(getMonthDataFor(locale.d, localeMonthIndexData()),
                                  localeMonthData(), month, format);
}